

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Bundle::Encode(Bundle *this,KDataStream *stream)

{
  bool bVar1;
  KUINT16 DataSize;
  pointer pKVar2;
  KOCTET *SerialData;
  reference this_00;
  Header7 *pHVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_38;
  const_iterator citrRefEnd;
  const_iterator citrRef;
  const_iterator citrObjEnd;
  const_iterator citrObj;
  KDataStream *stream_local;
  Bundle *this_local;
  
  citrObjEnd = std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>::begin
                         (&this->m_vStreams);
  citrRef._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>::end(&this->m_vStreams);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&citrObjEnd,
                       (__normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
                        *)&citrRef);
    if (!bVar1) break;
    pKVar2 = __gnu_cxx::
             __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
             ::operator->(&citrObjEnd);
    SerialData = KDataStream::GetBufferPtr(pKVar2);
    pKVar2 = __gnu_cxx::
             __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
             ::operator->(&citrObjEnd);
    DataSize = KDataStream::GetBufferSize(pKVar2);
    KDataStream::CopyFromBuffer(stream,SerialData,DataSize,Big_Endian);
    __gnu_cxx::
    __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
    ::operator++(&citrObjEnd);
  }
  citrRefEnd = std::
               vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
               ::begin(&this->m_vRefHeaders);
  local_38._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
       ::end(&this->m_vRefHeaders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrRefEnd,&local_38);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
              ::operator*(&citrRefEnd);
    pHVar3 = UTILS::KRef_Ptr<KDIS::PDU::Header7>::operator->(this_00);
    (*(pHVar3->super_Header6)._vptr_Header6[5])(pHVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
    ::operator++(&citrRefEnd);
  }
  return;
}

Assistant:

void Bundle::Encode( KDataStream & stream ) const
{
    // TODO: Check for 64 bit alignment and pad

    vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    for( ; citrObj != citrObjEnd; ++citrObj )
    {
        stream.CopyFromBuffer( citrObj->GetBufferPtr(), citrObj->GetBufferSize() );
    }

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        ( *citrRef )->Encode( stream );
    }
}